

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

int __thiscall hwtest::pgraph::anon_unknown_2::ScanContextTest::run(ScanContextTest *this)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  pointer pRVar3;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range3;
  ScanContextTest *this_local;
  
  if ((this->super_ScanTest).super_Test.chipset.card_type < 3) {
    ::nva_wr32((this->super_ScanTest).super_Test.cnum,0x4006a4,0xf000111);
  }
  if ((this->super_ScanTest).super_Test.chipset.card_type == 4) {
    ::nva_wr32((this->super_ScanTest).super_Test.cnum,0x40008c,0x1000000);
  }
  pgraph_rop_regs((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                   *)&__begin3,&(this->super_ScanTest).super_Test.chipset);
  __end3 = std::
           vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
           ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                    *)&__begin3);
  reg = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                                     *)&reg), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
              ::operator*(&__end3);
    pRVar3 = std::
             unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
             operator->(this_00);
    uVar2 = (*pRVar3->_vptr_Register[10])
                      (pRVar3,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                       &(this->super_ScanTest).super_Test.rnd);
    if ((uVar2 & 1) != 0) {
      (this->super_ScanTest).res = 3;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *)&__begin3);
  if ((this->super_ScanTest).super_Test.chipset.card_type < 4) {
    if ((this->super_ScanTest).super_Test.chipset.card_type < 3) {
      ScanTest::bitscan(&this->super_ScanTest,0x400680,0xffff,0);
      ScanTest::bitscan(&this->super_ScanTest,0x400684,0x11ffff,0);
    }
    else {
      ScanTest::bitscan(&this->super_ScanTest,0x400680,0xffff,0);
      ScanTest::bitscan(&this->super_ScanTest,0x400684,0xf1ffff,0);
      ScanTest::bitscan(&this->super_ScanTest,0x400688,0xffff,0);
      ScanTest::bitscan(&this->super_ScanTest,0x40068c,0x1ffff,0);
    }
  }
  else if ((this->super_ScanTest).super_Test.chipset.card_type < 0x10) {
    ScanTest::bitscan(&this->super_ScanTest,0x400714,0x110101,0);
  }
  else {
    ScanTest::bitscan(&this->super_ScanTest,0x400718,0x73110101,0);
  }
  return (this->super_ScanTest).res;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		}
		if (chipset.card_type == 4)
			nva_wr32(cnum, 0x40008c, 0x01000000);
		for (auto &reg : pgraph_rop_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		if (chipset.card_type < 4) {
			if (chipset.card_type < 3) {
				bitscan(0x400680, 0x0000ffff, 0);
				bitscan(0x400684, 0x0011ffff, 0);
			} else {
				bitscan(0x400680, 0x0000ffff, 0);
				bitscan(0x400684, 0x00f1ffff, 0);
				bitscan(0x400688, 0x0000ffff, 0);
				bitscan(0x40068c, 0x0001ffff, 0);
			}
		} else {
			if (chipset.card_type < 0x10) {
				bitscan(0x400714, 0x00110101, 0);
			} else {
				bitscan(0x400718, 0x73110101, 0);
			}
		}
		return res;
	}